

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  char *__s;
  ticks_t tVar1;
  TestCaseData *file;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  __s = skipPathFromFilename((char *)file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,in->m_name,&local_52);
  JUnitTestCaseData::add(&this->testCaseData,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  tVar1 = detail::getCurrentTicks();
  (this->timer).m_ticks = tVar1;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }